

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_image.c
# Opt level: O0

void jas_image_clearfmts(void)

{
  long lVar1;
  jas_image_fmtinfo_t *fmtinfo;
  int i;
  
  for (fmtinfo._4_4_ = 0; fmtinfo._4_4_ < jas_image_numfmts; fmtinfo._4_4_ = fmtinfo._4_4_ + 1) {
    lVar1 = (long)fmtinfo._4_4_;
    if (jas_image_fmtinfos[lVar1].name != (char *)0x0) {
      jas_free(jas_image_fmtinfos[lVar1].name);
      jas_image_fmtinfos[lVar1].name = (char *)0x0;
    }
    if (jas_image_fmtinfos[lVar1].ext != (char *)0x0) {
      jas_free(jas_image_fmtinfos[lVar1].ext);
      jas_image_fmtinfos[lVar1].ext = (char *)0x0;
    }
    if (jas_image_fmtinfos[lVar1].desc != (char *)0x0) {
      jas_free(jas_image_fmtinfos[lVar1].desc);
      jas_image_fmtinfos[lVar1].desc = (char *)0x0;
    }
  }
  jas_image_numfmts = 0;
  return;
}

Assistant:

void jas_image_clearfmts()
{
	int i;
	jas_image_fmtinfo_t *fmtinfo;
	for (i = 0; i < jas_image_numfmts; ++i) {
		fmtinfo = &jas_image_fmtinfos[i];
		if (fmtinfo->name) {
			jas_free(fmtinfo->name);
			fmtinfo->name = 0;
		}
		if (fmtinfo->ext) {
			jas_free(fmtinfo->ext);
			fmtinfo->ext = 0;
		}
		if (fmtinfo->desc) {
			jas_free(fmtinfo->desc);
			fmtinfo->desc = 0;
		}
	}
	jas_image_numfmts = 0;
}